

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocaltime.cpp
# Opt level: O1

SystemMillisRange * QLocalTime::computeSystemMillisRange(void)

{
  qint64 qVar1;
  qint64 qVar2;
  time_t tVar3;
  bool bVar4;
  SystemMillisRange *in_RDI;
  long lVar5;
  long in_FS_OFFSET;
  bool bVar6;
  tm local;
  anon_struct_16_2_491a6482 ends [2];
  tm local_98;
  int aiStack_60 [2];
  qint64 local_58 [4];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58[0] = 0x116bd2d1;
  local_58[1] = 0x7fffffffffffffff;
  local_58[2] = 3000;
  local_58[3] = 0x1d9731fe0bff;
  bVar4 = true;
  lVar5 = 8;
  do {
    qVar1 = *(qint64 *)((long)local_58 + lVar5);
    local_98.tm_wday = 0;
    local_98.tm_yday = 0;
    local_98.tm_gmtoff = 0;
    local_98.tm_zone = (char *)0x0;
    local_98.tm_year =
         (*(int *)((long)aiStack_60 + lVar5) - (*(int *)((long)aiStack_60 + lVar5) >> 0x1f)) +
         -0x76c;
    local_98.tm_mon = 0xb;
    local_98.tm_sec = 0x3b;
    local_98.tm_min = 0x3b;
    local_98.tm_hour = 0x17;
    local_98.tm_mday = 0x1f;
    local_98.tm_isdst = -1;
    local_98._36_4_ = 0;
    tVar3 = qMkTime(&local_98);
    if (tVar3 != -1) break;
    bVar4 = false;
    bVar6 = lVar5 != 0x18;
    lVar5 = lVar5 + 0x10;
    qVar1 = 0x1f3ffffffff;
  } while (bVar6);
  bVar6 = true;
  lVar5 = 8;
  do {
    qVar2 = *(qint64 *)((long)&DAT_0017b670 + lVar5);
    local_98.tm_wday = 0;
    local_98.tm_yday = 0;
    local_98.tm_sec = 0;
    local_98.tm_min = 0;
    local_98.tm_gmtoff = 0;
    local_98.tm_zone = (char *)0x0;
    local_98.tm_year =
         (*(int *)(&UNK_0017b668 + lVar5) - (*(int *)(&UNK_0017b668 + lVar5) >> 0x1f)) + -0x76c;
    local_98.tm_mon = 1;
    local_98.tm_hour = 0;
    local_98.tm_mday = 1;
    local_98.tm_isdst = -1;
    local_98._36_4_ = 0;
    tVar3 = qMkTime(&local_98);
    if (tVar3 != -1) {
      in_RDI->max = qVar1;
      in_RDI->minClip = bVar6;
      in_RDI->maxClip = bVar4;
      in_RDI->min = qVar2;
      goto LAB_00128b7d;
    }
    bVar6 = false;
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x58);
  in_RDI->min = 0;
  in_RDI->max = qVar1;
  in_RDI->minClip = false;
  in_RDI->maxClip = bVar4;
LAB_00128b7d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

SystemMillisRange computeSystemMillisRange()
{
    // Assert this here, as this is called just once, in a static initialization.
    Q_ASSERT(QGregorianCalendar::julianFromParts(1970, 1, 1) == JULIAN_DAY_FOR_EPOCH);

    constexpr qint64 TIME_T_MAX = std::numeric_limits<time_t>::max();
    using Bounds = std::numeric_limits<qint64>;
    constexpr bool isNarrow = Bounds::max() / MSECS_PER_SEC > TIME_T_MAX;
    if constexpr (isNarrow) {
        const qint64 msecsMax = quint64(TIME_T_MAX) * MSECS_PER_SEC - 1 + MSECS_PER_SEC;
        const qint64 msecsMin = -1 - msecsMax; // TIME_T_MIN is -1 - TIME_T_MAX
        // If we reach back to msecsMin, use it; otherwise, assume 1970 cut-off (MS).
        struct tm local = {};
        local.tm_year = tmYearFromQYear(1901);
        local.tm_mon = 11;
        local.tm_mday = 15; // A day and a bit after the start of 32-bit time_t:
        local.tm_isdst = -1;
        return {qMkTime(&local) == -1 ? 0 : msecsMin, msecsMax, false, false};
    } else {
        const struct { int year; qint64 millis; } starts[] = {
            { int(QDateTime::YearRange::First) + 1, Bounds::min() },
            // Beginning of the Common Era:
            { 1, -Q_INT64_C(62135596800000) },
            // Invention of the Gregorian calendar:
            { 1582, -Q_INT64_C(12244089600000) },
            // Its adoption by the anglophone world:
            { 1752, -Q_INT64_C(6879427200000) },
            // Before this, struct tm's tm_year is negative (Darwin):
            { 1900, -Q_INT64_C(2208988800000) },
        }, ends[] = {
            { int(QDateTime::YearRange::Last) - 1, Bounds::max() },
            // MS's end-of-range, end of year 3000:
            { 3000, Q_INT64_C(32535215999999) },
        };
        // Assume we do at least reach the end of a signed 32-bit time_t (since
        // our actual time_t is bigger than that):
        qint64 stop =
            quint64(std::numeric_limits<qint32>::max()) * MSECS_PER_SEC - 1 + MSECS_PER_SEC;
        // Cleared if first pass round loop fails:
        bool stopMax = true;
        for (const auto c : ends) {
            struct tm local = {};
            local.tm_year = tmYearFromQYear(c.year);
            local.tm_mon = 11;
            local.tm_mday = 31;
            local.tm_hour = 23;
            local.tm_min = local.tm_sec = 59;
            local.tm_isdst = -1;
            if (qMkTime(&local) != -1) {
                stop = c.millis;
                break;
            }
            stopMax = false;
        }
        bool startMin = true;
        for (const auto c : starts) {
            struct tm local {};
            local.tm_year = tmYearFromQYear(c.year);
            local.tm_mon = 1;
            local.tm_mday = 1;
            local.tm_isdst = -1;
            if (qMkTime(&local) != -1)
                return {c.millis, stop, startMin, stopMax};
            startMin = false;
        }
        return {0, stop, false, stopMax};
    }
}